

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactQuantizedBvh.h
# Opt level: O1

bool __thiscall
cbtGImpactQuantizedBvh::rayQuery
          (cbtGImpactQuantizedBvh *this,cbtVector3 *ray_dir,cbtVector3 *ray_origin,
          cbtAlignedObjectArray<int> *collided_results)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  BT_QUANTIZED_BVH_NODE *pBVar12;
  int *piVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  int *piVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 in_XMM16 [16];
  
  iVar9 = (this->m_box_tree).m_num_nodes;
  if (0 < iVar9) {
    iVar23 = 0;
    auVar25 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    auVar27 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    do {
      pBVar12 = (this->m_box_tree).m_node_array.super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.
                m_data;
      auVar16 = vcvtsi2ss_avx512f(in_XMM16,(uint)pBVar12[iVar23].m_quantizedAabbMin[0]);
      fVar1 = (this->m_box_tree).m_bvhQuantization.m_floats[0];
      fVar2 = (this->m_box_tree).m_bvhQuantization.m_floats[1];
      fVar3 = (this->m_box_tree).m_bvhQuantization.m_floats[2];
      fVar4 = (this->m_box_tree).m_global_bound.m_min.m_floats[0];
      fVar5 = (this->m_box_tree).m_global_bound.m_min.m_floats[1];
      fVar6 = (this->m_box_tree).m_global_bound.m_min.m_floats[2];
      auVar24 = vcvtsi2ss_avx512f(in_XMM16,(uint)pBVar12[iVar23].m_quantizedAabbMax[0]);
      fVar14 = fVar4 + auVar24._0_4_ / fVar1;
      fVar1 = (auVar16._0_4_ / fVar1 + fVar4 + fVar14) * 0.5;
      fVar14 = fVar14 - fVar1;
      fVar1 = ray_origin->m_floats[0] - fVar1;
      auVar24 = auVar25._0_16_;
      auVar16 = vandps_avx(auVar24,ZEXT416((uint)fVar1));
      if ((auVar16._0_4_ <= fVar14) || (fVar1 * ray_dir->m_floats[0] < 0.0)) {
        auVar16 = vcvtsi2ss_avx512f(in_XMM16,(uint)pBVar12[iVar23].m_quantizedAabbMin[1]);
        auVar17 = vcvtsi2ss_avx512f(in_XMM16,(uint)pBVar12[iVar23].m_quantizedAabbMax[1]);
        fVar4 = fVar5 + auVar17._0_4_ / fVar2;
        fVar2 = (auVar16._0_4_ / fVar2 + fVar5 + fVar4) * 0.5;
        fVar4 = fVar4 - fVar2;
        fVar2 = ray_origin->m_floats[1] - fVar2;
        auVar16 = vandps_avx(auVar24,ZEXT416((uint)fVar2));
        if ((fVar4 < auVar16._0_4_) && (0.0 <= fVar2 * ray_dir->m_floats[1])) goto LAB_009282e9;
        auVar16 = vcvtsi2ss_avx512f(in_XMM16,(uint)pBVar12[iVar23].m_quantizedAabbMin[2]);
        auVar17 = vcvtsi2ss_avx512f(in_XMM16,(uint)pBVar12[iVar23].m_quantizedAabbMax[2]);
        fVar5 = fVar6 + auVar17._0_4_ / fVar3;
        fVar3 = (auVar16._0_4_ / fVar3 + fVar6 + fVar5) * 0.5;
        fVar5 = fVar5 - fVar3;
        fVar3 = ray_origin->m_floats[2] - fVar3;
        auVar16 = vandps_avx(auVar24,ZEXT416((uint)fVar3));
        if ((fVar5 < auVar16._0_4_) && (0.0 <= fVar3 * ray_dir->m_floats[2])) goto LAB_009282e9;
        fVar6 = ray_dir->m_floats[1];
        fVar7 = ray_dir->m_floats[2];
        auVar16 = vfmsub231ss_fma(ZEXT416((uint)(fVar7 * fVar2)),ZEXT416((uint)fVar6),
                                  ZEXT416((uint)fVar3));
        auVar26 = auVar27._0_16_;
        auVar16 = vandps_avx(auVar26,auVar16);
        auVar17 = vandps_avx(ZEXT416((uint)fVar7),auVar26);
        auVar15 = vandps_avx(auVar26,ZEXT416((uint)fVar6));
        auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * auVar15._0_4_)),ZEXT416((uint)fVar4),
                                  auVar17);
        if (auVar18._0_4_ < auVar16._0_4_) goto LAB_009282e9;
        fVar8 = ray_dir->m_floats[0];
        auVar16 = vfmsub213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar1),
                                  ZEXT416((uint)(fVar8 * fVar3)));
        auVar16 = vandps_avx(auVar16,auVar26);
        auVar18 = vandps_avx(ZEXT416((uint)fVar8),auVar26);
        auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * auVar18._0_4_)),ZEXT416((uint)fVar14),
                                  auVar17);
        if (auVar17._0_4_ < auVar16._0_4_) goto LAB_009282e9;
        auVar16 = vfmsub213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar8),
                                  ZEXT416((uint)(fVar1 * fVar6)));
        auVar16 = vandps_avx(auVar24,auVar16);
        auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * auVar18._0_4_)),ZEXT416((uint)fVar14),
                                  auVar15);
        bVar19 = auVar16._0_4_ <= auVar24._0_4_;
      }
      else {
LAB_009282e9:
        bVar19 = false;
      }
      iVar10 = pBVar12[iVar23].m_escapeIndexOrDataIndex;
      if ((bVar19) && (-1 < iVar10)) {
        iVar11 = collided_results->m_size;
        if (iVar11 == collided_results->m_capacity) {
          iVar22 = iVar11 * 2;
          if (iVar11 == 0) {
            iVar22 = 1;
          }
          if (collided_results->m_capacity < iVar22) {
            if (iVar22 == 0) {
              piVar20 = (int *)0x0;
            }
            else {
              piVar20 = (int *)cbtAlignedAllocInternal((long)iVar22 << 2,0x10);
            }
            iVar11 = collided_results->m_size;
            if (0 < (long)iVar11) {
              piVar13 = collided_results->m_data;
              lVar21 = 0;
              do {
                piVar20[lVar21] = piVar13[lVar21];
                lVar21 = lVar21 + 1;
              } while (iVar11 != lVar21);
            }
            auVar25 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
            auVar27 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
            if (collided_results->m_data != (int *)0x0) {
              if (collided_results->m_ownsMemory == true) {
                cbtAlignedFreeInternal(collided_results->m_data);
                auVar27 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                auVar25 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
              }
              collided_results->m_data = (int *)0x0;
            }
            collided_results->m_ownsMemory = true;
            collided_results->m_data = piVar20;
            collided_results->m_capacity = iVar22;
          }
        }
        collided_results->m_data[collided_results->m_size] = iVar10;
        collided_results->m_size = collided_results->m_size + 1;
      }
      if ((bool)(~bVar19 & iVar10 < 0)) {
        iVar23 = iVar23 - (this->m_box_tree).m_node_array.
                          super_cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>.m_data[iVar23].
                          m_escapeIndexOrDataIndex;
      }
      else {
        iVar23 = iVar23 + 1;
      }
    } while (iVar23 < iVar9);
  }
  return 0 < collided_results->m_size;
}

Assistant:

SIMD_FORCE_INLINE int getNodeCount() const
	{
		return m_num_nodes;
	}